

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

int is_number(int c)

{
  return (int)(c - 0x2dU < 2 || c - 0x30U < 10);
}

Assistant:

int is_number(int c)
{
  if (c >= '0' && c <= '9')
    return 1;
  if (c == '-')
    return 1;
  if (c == '.')
    return 1;
  return 0;
}